

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O3

int Amap_ManFindCut(Amap_Obj_t *pNode,Amap_Obj_t *pFanin,int fComplFanin,int Val,Vec_Ptr_t *vCuts)

{
  size_t __size;
  uint uVar1;
  void **ppvVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  uint uVar6;
  int iVar7;
  
  vCuts->nSize = 0;
  uVar3 = *(uint *)&pFanin->field_0x8;
  uVar6 = 1;
  if (0xfff < uVar3) {
    puVar5 = (uint *)(pFanin->field_11).pData;
    iVar7 = 0;
    uVar6 = 0;
    do {
      uVar1 = *puVar5;
      iVar4 = 0;
      if ((uVar1 & 0xffff) != 0) {
        if (1 < (uint)fComplFanin) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf1,"int Abc_Var2Lit(int, int)");
        }
        iVar4 = (uVar1 >> 0x10 & 1 ^ fComplFanin) + (uVar1 & 0xffff) * 2;
      }
      if (iVar4 == Val) {
        if (iVar7 == vCuts->nCap) {
          if (iVar7 < 0x10) {
            if (vCuts->pArray == (void **)0x0) {
              ppvVar2 = (void **)malloc(0x80);
            }
            else {
              ppvVar2 = (void **)realloc(vCuts->pArray,0x80);
            }
            vCuts->pArray = ppvVar2;
            vCuts->nCap = 0x10;
          }
          else {
            __size = (ulong)(uint)(iVar7 * 2) * 8;
            if (vCuts->pArray == (void **)0x0) {
              ppvVar2 = (void **)malloc(__size);
            }
            else {
              ppvVar2 = (void **)realloc(vCuts->pArray,__size);
            }
            vCuts->pArray = ppvVar2;
            vCuts->nCap = iVar7 * 2;
          }
        }
        else {
          ppvVar2 = vCuts->pArray;
        }
        iVar4 = vCuts->nSize;
        iVar7 = iVar4 + 1;
        vCuts->nSize = iVar7;
        ppvVar2[iVar4] = puVar5;
        uVar1 = *puVar5;
        uVar3 = *(uint *)&pFanin->field_0x8;
      }
      uVar6 = uVar6 + 1;
      puVar5 = puVar5 + (ulong)(uVar1 >> 0x11) + 1;
    } while (uVar6 < uVar3 >> 0xc);
    uVar6 = (uint)(iVar7 == 0);
  }
  return uVar6;
}

Assistant:

int Amap_ManFindCut( Amap_Obj_t * pNode, Amap_Obj_t * pFanin, int fComplFanin, int Val, Vec_Ptr_t * vCuts )
{
    Amap_Cut_t * pCut;
    int c, iCompl, iFan;
    Vec_PtrClear( vCuts );
    Amap_NodeForEachCut( pFanin, pCut, c )
    {
        iCompl = pCut->fInv ^ fComplFanin;
        iFan   = !pCut->iMat? 0: Abc_Var2Lit( pCut->iMat, iCompl );
        if ( iFan == Val )
            Vec_PtrPush( vCuts, pCut );
    }
    return Vec_PtrSize(vCuts) == 0;
}